

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O2

int anon_unknown.dwarf_22b2f::ChannelOut_nrpn(lua_State *L)

{
  ChannelOut *this;
  ulong uVar1;
  ulong uVar2;
  
  this = getChannelOut(L,1);
  uVar1 = luaL_checkinteger(L,2);
  uVar2 = luaL_checkinteger(L,3);
  if (0x3fff < uVar1) {
    luaL_argerror(L,2,"Parameter number must be between 0 and 16383");
  }
  if (0x3fff < uVar2) {
    luaL_argerror(L,3,"Parameter value must be between 0 and 16383");
  }
  ChannelOut::send<int,int,long>(this,this->index + 0xb0,0x62,(ulong)((uint)uVar1 & 0x7f));
  ChannelOut::send<int,int,long>(this,this->index + 0xb0,99,(ulong)((uint)uVar1 >> 7 & 0x7f));
  ChannelOut::send<int,int,long>(this,this->index + 0xb0,6,(ulong)((uint)(uVar2 >> 7) & 0x7f));
  ChannelOut::send<int,int,long>(this,this->index + 0xb0,0x26,(ulong)((uint)uVar2 & 0x7f));
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_nrpn(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer number = luaL_checkinteger(L, 2);
	lua_Integer value = luaL_checkinteger(L, 3);

	luaL_argcheck(L, number >= 0 && number <= 0x3FFF, 2, "Parameter number must be between 0 and 16383");
	luaL_argcheck(L, value >= 0 && value <= 0x3FFF, 3, "Parameter value must be between 0 and 16383");

	self.send(0xB0 + self.index, 0x62, number & 0x7Fu);
	self.send(0xB0 + self.index, 0x63, (number >> 7) & 0x7Fu);
	self.send(0xB0 + self.index, 0x06, (value >> 7) & 0x7Fu);
	self.send(0xB0 + self.index, 0x26, value & 0x7Fu);
	lua_settop(L, 1);
	return 1;
}